

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O0

void snapshot_before_block_reuse_test(bool inmem)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  int iVar3;
  char *pcVar4;
  byte in_DIL;
  fdb_status s_17;
  fdb_status s_16;
  fdb_status s_15;
  fdb_status s_14;
  fdb_status s_13;
  fdb_status s_12;
  fdb_status s_11;
  fdb_status s_10;
  fdb_status s_9;
  fdb_status s_8;
  fdb_status s_7;
  fdb_status s_6;
  fdb_status s_5;
  fdb_status s_4;
  fdb_status s_3;
  fdb_status s_2;
  char *val;
  char *key;
  fdb_status s_1;
  fdb_status s;
  fdb_file_info file_info;
  sb_decision_t sb_decision;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  char bodybuf [256];
  size_t rvalue_len;
  void *rvalue;
  int r;
  int n;
  int j;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffaf8;
  fdb_file_handle *in_stack_fffffffffffffb00;
  FILE *pFVar5;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  void **in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  fdb_file_info *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  fdb_config *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  fdb_file_handle **in_stack_fffffffffffffd28;
  ulong local_2d0;
  fdb_seqnum_t in_stack_fffffffffffffda0;
  fdb_kvs_handle **in_stack_fffffffffffffda8;
  fdb_kvs_handle *in_stack_fffffffffffffdb0;
  fdb_status local_194;
  char local_178 [256];
  size_t local_78;
  void *local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  byte local_1;
  
  local_1 = in_DIL & 1;
  memleak_start();
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_68 = system("rm -rf  staleblktest* > errorlog.txt");
  fVar1 = fdb_open(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x20a);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x20a,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffffb00,(fdb_kvs_handle **)in_stack_fffffffffffffaf8,
                     (fdb_kvs_config *)0x107d70);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x20c);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x20c,"void snapshot_before_block_reuse_test(bool)");
  }
  strlen("key");
  strlen("snp");
  fVar1 = fdb_set_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
                     ,in_stack_fffffffffffffb30,
                     CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                     in_stack_fffffffffffffb20,
                     CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x213);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x213,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffaf8,'\0');
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x217);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x217,"void snapshot_before_block_reuse_test(bool)");
  }
  if ((local_1 & 1) == 0) {
    fVar1 = fdb_snapshot_open(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                              in_stack_fffffffffffffda0);
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x21f);
      snapshot_before_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x21f,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  else {
    fVar1 = fdb_snapshot_open(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                              in_stack_fffffffffffffda0);
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x21c);
      snapshot_before_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x21c,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  local_5c = 0;
  do {
    strlen("key");
    strlen("val");
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                       in_stack_fffffffffffffb30,
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       in_stack_fffffffffffffb20,
                       CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x228);
      snapshot_before_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x228,"void snapshot_before_block_reuse_test(bool)");
    }
    local_5c = local_5c + 1;
    fVar1 = fdb_get_file_info((fdb_file_handle *)
                              CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                              in_stack_fffffffffffffb30);
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x22b);
      snapshot_before_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x22b,"void snapshot_before_block_reuse_test(bool)");
    }
  } while (local_2d0 < 0x1000001);
  for (local_64 = 0; local_64 < 5; local_64 = local_64 + 1) {
    for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
      strlen("key");
      strlen("val");
      fVar1 = fdb_set_kv((fdb_kvs_handle *)
                         CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                         in_stack_fffffffffffffb30,
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                         in_stack_fffffffffffffb20,
                         CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      pFVar5 = _stderr;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcVar4 = fdb_error_msg(fVar1);
        fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x232);
        snapshot_before_block_reuse_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x232,"void snapshot_before_block_reuse_test(bool)");
      }
    }
    fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffaf8,'\0');
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x236);
      snapshot_before_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x236,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  sVar2 = sb_check_block_reusing
                    ((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
                    );
  if (sVar2 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x23b);
    snapshot_before_block_reuse_test::__test_pass = 0;
    if (sVar2 != SBD_RECLAIM) {
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x23b,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  strlen("key");
  fVar1 = fdb_get_kv((fdb_kvs_handle *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38)
                     ,in_stack_fffffffffffffb30,
                     CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                     in_stack_fffffffffffffb20,
                     (size_t *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x23f);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x23f,"void snapshot_before_block_reuse_test(bool)");
  }
  iVar3 = memcmp(local_70,"snp",local_78);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","snp",local_70,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x240);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x240,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffffaf8);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x244);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x244,"void snapshot_before_block_reuse_test(bool)");
  }
  for (local_60 = 0; local_60 < local_5c; local_60 = local_60 + 1) {
    strlen("key");
    strlen("val");
    fVar1 = fdb_set_kv((fdb_kvs_handle *)
                       CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                       in_stack_fffffffffffffb30,
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       in_stack_fffffffffffffb20,
                       CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    pFVar5 = _stderr;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x24a);
      snapshot_before_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x24a,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffffaf8,'\0');
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x24d);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x24d,"void snapshot_before_block_reuse_test(bool)");
  }
  local_194 = fdb_snapshot_open(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                                in_stack_fffffffffffffda0);
  if (local_194 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_close(in_stack_fffffffffffffaf8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pFVar5 = _stderr;
      pcVar4 = fdb_error_msg(fVar1);
      fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x254);
      snapshot_before_block_reuse_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x254,"void snapshot_before_block_reuse_test(bool)");
    }
    local_194 = FDB_RESULT_SUCCESS;
  }
  if (local_194 != FDB_RESULT_NO_DB_INSTANCE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x256);
    snapshot_before_block_reuse_test::__test_pass = 0;
    if (local_194 != FDB_RESULT_NO_DB_INSTANCE) {
      __assert_fail("status == FDB_RESULT_NO_DB_INSTANCE",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x256,"void snapshot_before_block_reuse_test(bool)");
    }
  }
  fVar1 = fdb_free_block((void *)0x108bdb);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pFVar5 = _stderr;
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x259);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x259,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar1 = fdb_kvs_close(in_stack_fffffffffffffaf8);
  pFVar5 = _stderr;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    pcVar4 = fdb_error_msg(fVar1);
    fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x25b);
    snapshot_before_block_reuse_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x25b,"void snapshot_before_block_reuse_test(bool)");
  }
  fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffffaf8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    pcVar4 = "disk snapshot";
    if ((local_1 & 1) != 0) {
      pcVar4 = "in-mem snapshot";
    }
    sprintf(local_178,"snapshot before block reuse test %s",pcVar4);
    if (snapshot_before_block_reuse_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n",local_178);
    }
    else {
      fprintf(_stderr,"%s PASSED\n",local_178);
    }
    return;
  }
  pFVar5 = _stderr;
  pcVar4 = fdb_error_msg(fVar1);
  fprintf(pFVar5,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar1,pcVar4,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x25d);
  snapshot_before_block_reuse_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x25d,"void snapshot_before_block_reuse_test(bool)");
}

Assistant:

void snapshot_before_block_reuse_test(bool inmem) {
    memleak_start();
    TEST_INIT();

    int i, j, n, r;
    void *rvalue;
    size_t rvalue_len;
    char bodybuf[256];
    fdb_file_handle* dbfile;
    fdb_kvs_handle *db, *snap_db;
    fdb_status status;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fconfig.num_keeping_headers = 1;
    status = fdb_open(&dbfile, "./staleblktest1", &fconfig);
    TEST_STATUS(status);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_STATUS(status);

    const char *key = "key";
    const char *val = "snp";

    // set key
    status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
    TEST_STATUS(status);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // open snapshot
    if (inmem) {
        status = fdb_snapshot_open(db, &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_STATUS(status);
    } else {
        status = fdb_snapshot_open(db, &snap_db, 1);
        TEST_STATUS(status);
    }

    val = "val";

    // initial load to reuse
    i = 0;
    do {
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size <= SB_MIN_BLOCK_REUSING_FILESIZE);

    // 5 update cycles of created items
    for (n = 0; n < 5; n++) {
        for(j = 0; j < i; j++) {
            status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
            TEST_STATUS(status);
        }
        // commit
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // verify in reclaim mode
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // expect pre-reuse data retained
    status = fdb_get_kv(snap_db, key, strlen(key) + 1, &rvalue, &rvalue_len);
    TEST_STATUS(status);
    TEST_CMP(rvalue, (char *)"snp", rvalue_len);

    // close snapshot
    status = fdb_kvs_close(snap_db);
    TEST_STATUS(status);

    // do another update cycle
    for (j = 0; j < i; j++) {
        // commit
        status = fdb_set_kv(db, key, strlen(key) + 1, val, strlen(val) + 1);
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // attempt to open again will fail
    status = fdb_snapshot_open(db, &snap_db, 1);
    if (status == FDB_RESULT_SUCCESS) {
        // close incase kv was unexpectedly opened
        status = fdb_kvs_close(snap_db);
        TEST_STATUS(status);
    }
    TEST_CHK(status == FDB_RESULT_NO_DB_INSTANCE);

    status = fdb_free_block(rvalue);
    TEST_STATUS(status);
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf,"snapshot before block reuse test %s", inmem ?
            "in-mem snapshot" : "disk snapshot");
    TEST_RESULT(bodybuf);
}